

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

BOOL __thiscall
Js::DynamicObject::SetObjectArrayItemWritable
          (DynamicObject *this,PropertyId propertyId,BOOL writable)

{
  bool bVar1;
  int iVar2;
  ArrayObject *pAVar3;
  bool bVar4;
  bool result;
  BOOL writable_local;
  PropertyId propertyId_local;
  DynamicObject *this_local;
  
  bVar1 = HasObjectArray(this);
  bVar4 = false;
  if (bVar1) {
    pAVar3 = GetObjectArrayOrFlagsAsArray(this);
    iVar2 = (*(pAVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3b])
                      (pAVar3,(ulong)(uint)propertyId,(ulong)(uint)writable);
    bVar4 = iVar2 != 0;
  }
  if ((writable == 0) && (bVar4)) {
    InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype(this);
  }
  return (BOOL)bVar4;
}

Assistant:

BOOL DynamicObject::SetObjectArrayItemWritable(PropertyId propertyId, BOOL writable)
    {
        const auto result = HasObjectArray() && GetObjectArrayOrFlagsAsArray()->SetWritable(propertyId, writable);
        if (!writable && result)
        {
            InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype();
        }
        return result;
    }